

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

QString * QMakeEvaluator::formatValueList(ProStringList *vals,bool commas)

{
  bool bVar1;
  ProString *pPVar2;
  byte in_DL;
  QList<ProString> *in_RDI;
  long in_FS_OFFSET;
  ProString *str;
  ProStringList *__range1;
  QString *ret;
  const_iterator __end1;
  const_iterator __begin1;
  QList<ProString> *this;
  QChar c;
  QList<ProString> *pQVar3;
  ProString *in_stack_ffffffffffffffc0;
  QLatin1Char local_27 [4];
  QLatin1Char local_23 [3];
  ProString *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this = in_RDI;
  pQVar3 = in_RDI;
  QString::QString((QString *)0x2f1a2e);
  local_10.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<ProString>::begin(this);
  local_18.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_18 = QList<ProString>::end(this);
  while( true ) {
    local_20 = local_18.i;
    bVar1 = QList<ProString>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar1) break;
    pPVar2 = QList<ProString>::const_iterator::operator*(&local_10);
    c.ucs = (char16_t)((ulong)pPVar2 >> 0x30);
    bVar1 = QString::isEmpty((QString *)0x2f1ac6);
    if (!bVar1) {
      if ((in_DL & 1) != 0) {
        QLatin1Char::QLatin1Char(local_23,',');
        QChar::QChar<QLatin1Char,_true>((QChar *)this,(QLatin1Char)(char)((ushort)c.ucs >> 8));
        QString::operator+=((QString *)this,c);
      }
      QLatin1Char::QLatin1Char(local_27,' ');
      QChar::QChar<QLatin1Char,_true>((QChar *)this,(QLatin1Char)(char)((ushort)c.ucs >> 8));
      QString::operator+=((QString *)this,c);
    }
    formatValue(in_stack_ffffffffffffffc0,SUB81((ulong)pQVar3 >> 0x38,0));
    QString::operator+=((QString *)this,(QString *)in_RDI);
    QString::~QString((QString *)0x2f1b52);
    QList<ProString>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)this;
}

Assistant:

QString QMakeEvaluator::formatValueList(const ProStringList &vals, bool commas)
{
    QString ret;

    for (const ProString &str : vals) {
        if (!ret.isEmpty()) {
            if (commas)
                ret += QLatin1Char(',');
            ret += QLatin1Char(' ');
        }
        ret += formatValue(str);
    }
    return ret;
}